

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UESS.h
# Opt level: O0

Estimates * UESS(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  pointer *this;
  _Bit_pointer *this_00;
  VertexIdx n;
  __type _Var1;
  CGraph g;
  bool bVar2;
  result_type_conflict1 rVar3;
  reference pOVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  byte bVar8;
  iterator iVar9;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  double local_52b8;
  VertexIdx *in_stack_ffffffffffffad68;
  bool local_3eb9;
  _Bit_type *local_3eb8;
  uint local_3eb0;
  _Bit_type *local_3ea8;
  uint local_3ea0;
  _Bit_type *local_3e98;
  uint local_3e90;
  _Bit_type *local_3e88;
  uint local_3e80;
  difference_type local_3e78;
  VertexIdx vertices_seen;
  _Bit_type *local_3e68;
  uint local_3e60;
  _Bit_type *local_3e58;
  uint local_3e50;
  _Bit_type *local_3e48;
  uint local_3e40;
  _Bit_type *local_3e38;
  uint local_3e30;
  difference_type local_3e28;
  VertexIdx edges_seen;
  double triangleEstimate;
  double scale;
  double p;
  VertexIdx VStack_3e00;
  EdgeIdx local_3df8;
  EdgeIdx *pEStack_3df0;
  undefined1 local_3de8 [8];
  Estimates triangles_in_Gp;
  vector<long,_std::allocator<long>_> local_3db0;
  undefined1 auStack_3d98 [8];
  CGraph CG_p;
  OrderedEdge edge;
  __normal_iterator<OrderedEdge_*,_std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>_>
  local_3d50;
  iterator __end1;
  iterator __begin1;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> *__range1;
  vector<long,_std::allocator<long>_> dsts;
  vector<long,_std::allocator<long>_> srcs;
  OrderedEdgeCollection local_3c60;
  undefined1 local_3be8 [8];
  Estimates edge_count_output;
  OrderedEdgeCollection local_2840;
  undefined1 local_27c8 [8];
  mt19937 mt;
  undefined1 local_1430 [8];
  random_device rd;
  int skip;
  double edge_estimate;
  double running_count;
  OrderedEdgeCollection randomEdgeCollection;
  Parameters *params_local;
  CGraph *cg_local;
  
  bVar8 = 0;
  randomEdgeCollection.no_of_query = (VertexIdx)params;
  OrderedEdgeCollection::OrderedEdgeCollection((OrderedEdgeCollection *)&running_count);
  rd.field_0._M_mt._M_p._4_4_ = 1;
  std::random_device::random_device((random_device *)local_1430);
  rVar3 = std::random_device::operator()((random_device *)local_1430);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_27c8,(ulong)rVar3);
  memcpy(&edge_count_output.query_complexity,local_27c8,5000);
  pdVar6 = &edge_count_output.query_complexity;
  pdVar7 = &local_52b8;
  for (lVar5 = 0x271; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = *pdVar6;
    pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
  }
  GetEdgesByUniSampling(&local_2840,cg,params);
  OrderedEdgeCollection::operator=((OrderedEdgeCollection *)&running_count,&local_2840);
  OrderedEdgeCollection::~OrderedEdgeCollection(&local_2840);
  if ((params->normalization_count_available & 1U) == 0) {
    OrderedEdgeCollection::OrderedEdgeCollection
              (&local_3c60,(OrderedEdgeCollection *)&running_count);
    Parameters::Parameters
              ((Parameters *)
               &srcs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,params);
    EstimateEdgeCount((Estimates *)local_3be8,cg,&local_3c60,
                      (Parameters *)
                      &srcs.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,rd.field_0._M_mt._M_p._4_4_);
    Parameters::~Parameters
              ((Parameters *)
               &srcs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    OrderedEdgeCollection::~OrderedEdgeCollection(&local_3c60);
  }
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &dsts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&__range1)
  ;
  __end1 = std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::begin
                     ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection);
  local_3d50._M_current =
       (OrderedEdge *)
       std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::end
                 ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_3d50), bVar2) {
    pOVar4 = __gnu_cxx::
             __normal_iterator<OrderedEdge_*,_std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>_>
             ::operator*(&__end1);
    CG_p.nbors = (VertexIdx *)pOVar4->u;
    edge.u = pOVar4->v;
    edge.v = pOVar4->index;
    edge.index = pOVar4->degree;
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,std::allocator<long>> *)
               &dsts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,(long *)&CG_p.nbors);
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,std::allocator<long>> *)&__range1,&edge.u);
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,std::allocator<long>> *)
               &dsts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&edge.u);
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,std::allocator<long>> *)&__range1,(long *)&CG_p.nbors);
    __gnu_cxx::
    __normal_iterator<OrderedEdge_*,_std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>_>::
    operator++(&__end1);
  }
  n = cg->nVertices;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_3db0,
             (vector<long,_std::allocator<long>_> *)
             &dsts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&triangles_in_Gp.query_complexity,
             (vector<long,_std::allocator<long>_> *)&__range1);
  MakeMultiGraph((CGraph *)auStack_3d98,n,&local_3db0,
                 (vector<long,_std::allocator<long>_> *)&triangles_in_Gp.query_complexity);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&triangles_in_Gp.query_complexity);
  std::vector<long,_std::allocator<long>_>::~vector(&local_3db0);
  CountExactTriangles((Estimates *)local_3de8,(CGraph *)auStack_3d98);
  local_3df8 = CG_p.nEdges;
  pEStack_3df0 = CG_p.offsets;
  p = (double)auStack_3d98;
  VStack_3e00 = CG_p.nVertices;
  local_52b8 = (double)auStack_3d98;
  g.nEdges = CG_p.nEdges;
  g.nVertices = CG_p.nVertices;
  g.offsets = CG_p.offsets;
  g.nbors = in_stack_ffffffffffffad68;
  Escape::delCGraph(g);
  scale = ((double)(long)running_count + (double)(long)running_count) / (double)cg->nEdges;
  _Var1 = std::pow<double,int>(scale,3);
  triangleEstimate = 1.0 / _Var1;
  edges_seen = (VertexIdx)((double)local_3de8 * triangleEstimate);
  __return_storage_ptr__->estimate = 0.0;
  __return_storage_ptr__->fraction_of_vertices_seen = 1.0;
  __return_storage_ptr__->fraction_of_edges_seen = 1.0;
  __return_storage_ptr__->query_complexity = 1.0;
  __return_storage_ptr__->estimate = (double)edges_seen;
  this = &randomEdgeCollection.edge_list.
          super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  iVar9 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)this);
  local_3e48 = iVar9.super__Bit_iterator_base._M_p;
  local_3e40 = iVar9.super__Bit_iterator_base._M_offset;
  local_3e38 = local_3e48;
  local_3e30 = local_3e40;
  iVar9 = std::vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)this)
  ;
  local_3e68 = iVar9.super__Bit_iterator_base._M_p;
  local_3e60 = iVar9.super__Bit_iterator_base._M_offset;
  vertices_seen._7_1_ = 1;
  __first.super__Bit_iterator_base._M_offset = local_3e30;
  __first.super__Bit_iterator_base._M_p = local_3e38;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar9.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar9.super__Bit_iterator_base._0_12_,8);
  __first.super__Bit_iterator_base._12_4_ = 0;
  local_3e58 = local_3e68;
  local_3e50 = local_3e60;
  local_3e28 = std::count<std::_Bit_iterator,bool>
                         (__first,__last,(bool *)((long)&vertices_seen + 7));
  this_00 = &randomEdgeCollection.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_end_of_storage;
  iVar9 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)this_00);
  local_3e98 = iVar9.super__Bit_iterator_base._M_p;
  local_3e90 = iVar9.super__Bit_iterator_base._M_offset;
  local_3e88 = local_3e98;
  local_3e80 = local_3e90;
  iVar9 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)this_00);
  local_3eb8 = iVar9.super__Bit_iterator_base._M_p;
  local_3eb0 = iVar9.super__Bit_iterator_base._M_offset;
  local_3eb9 = true;
  __first_00.super__Bit_iterator_base._M_offset = local_3e80;
  __first_00.super__Bit_iterator_base._M_p = local_3e88;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar9.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar9.super__Bit_iterator_base._0_12_,8);
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  local_3ea8 = local_3eb8;
  local_3ea0 = local_3eb0;
  local_3e78 = std::count<std::_Bit_iterator,bool>(__first_00,__last_00,&local_3eb9);
  __return_storage_ptr__->fraction_of_vertices_seen =
       ((double)local_3e78 * 100.0) / (double)cg->nVertices;
  __return_storage_ptr__->fraction_of_edges_seen = ((double)local_3e28 * 100.0) / (double)cg->nEdges
  ;
  __return_storage_ptr__->query_complexity =
       ((double)(long)randomEdgeCollection.visited_vertex_set.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_end_of_storage * 100.0) / (double)cg->nEdges;
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&__range1);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &dsts.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::random_device::~random_device((random_device *)local_1430);
  OrderedEdgeCollection::~OrderedEdgeCollection((OrderedEdgeCollection *)&running_count);
  return __return_storage_ptr__;
}

Assistant:

Estimates UESS(CGraph *cg, Parameters params)
{
    /**
    * Set up local variables. skip parameter is used in estimating the number of edges in the graph.
    */
    OrderedEdgeCollection randomEdgeCollection;
    double running_count = 0.0, edge_estimate=0.0;
    int skip = 1;

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Perform a random walk through the graph, and collect the edges in the process
     * The fourth parameter is set to false to indicate that we do not care about the
     * vertex ordering of each edge
     */
    randomEdgeCollection = GetEdgesByUniSampling(cg, params, mt);

    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    std::vector<VertexIdx > srcs;
    std::vector<VertexIdx > dsts;

    for (auto edge : randomEdgeCollection.edge_list) {
        srcs.emplace_back(edge.u);
        dsts.emplace_back(edge.v);
        srcs.emplace_back(edge.v);  // The graph representation (adjacency list) requires both the edges to be present
        dsts.emplace_back(edge.u);
    }
    /**
     * Construct the induced graph G_p
     * Note that G_p is a multi-graph. When counting triangles exactly in G_p, we consider this multiplicity.
     */
    CGraph CG_p = MakeMultiGraph(cg->nVertices,srcs,dsts);

    /**
     * Count the exact number of triangles in the sparsified graph CG_p and scale it up.
     */

    Estimates triangles_in_Gp = CountExactTriangles(&CG_p);
    delCGraph(CG_p);
    double p = randomEdgeCollection.no_of_edges *2.0 / cg->nEdges;
    double scale = 1.0 / pow(p,3);
    double triangleEstimate = triangles_in_Gp.estimate * scale ;

    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(randomEdgeCollection.visited_edge_set.begin(),randomEdgeCollection.visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(randomEdgeCollection.visited_vertex_set.begin(),randomEdgeCollection.visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / cg->nVertices;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / cg->nEdges;
    return_estimate.query_complexity = randomEdgeCollection.no_of_query * 100.0 /cg->nEdges;

    return return_estimate;
}